

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O1

void Map_MappingReportChoices(Map_Man_t *pMan)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  Map_Node_t *pMVar9;
  
  if ((long)pMan->nOutputs < 1) {
    uVar3 = 0;
  }
  else {
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar5 = *(uint *)(((ulong)pMan->pOutputs[lVar2] & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff;
      if (uVar3 <= uVar5) {
        uVar3 = uVar5;
      }
      lVar2 = lVar2 + 1;
    } while (pMan->nOutputs != lVar2);
  }
  pMan->nTravIds = pMan->nTravIds + 1;
  uVar5 = pMan->nOutputs;
  if (0 < (int)uVar5) {
    lVar2 = 0;
    do {
      Map_MappingUpdateLevel_rec
                (pMan,(Map_Node_t *)((ulong)pMan->pOutputs[lVar2] & 0xfffffffffffffffe),0);
      lVar2 = lVar2 + 1;
      uVar5 = pMan->nOutputs;
    } while (lVar2 < (int)uVar5);
  }
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar6 = 0;
    uVar1 = 0;
    do {
      uVar8 = *(uint *)(((ulong)pMan->pOutputs[uVar6] & 0xfffffffffffffffe) + 0x1c) >> 5;
      if (uVar1 <= (uVar8 & 0xffff)) {
        uVar1 = uVar8 & 0xffff;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  lVar2 = (long)pMan->vMapObjs->nSize;
  uVar5 = 0;
  if (0 < lVar2) {
    lVar7 = 0;
    uVar5 = 0;
    uVar4 = 0;
    do {
      pMVar9 = pMan->vMapObjs->pArray[lVar7];
      if ((pMVar9->pRepr == (Map_Node_t *)0x0) && (pMVar9->pNextE != (Map_Node_t *)0x0)) {
        uVar5 = uVar5 + 1;
        for (; pMVar9 != (Map_Node_t *)0x0; pMVar9 = pMVar9->pNextE) {
          uVar4 = uVar4 + 1;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar2);
  }
  printf("Maximum level: Original = %d. Reduced due to choices = %d.\n",(ulong)uVar3);
  printf("Choice stats:  Choice nodes = %d. Total choices = %d.\n",(ulong)uVar5,(ulong)uVar4);
  return;
}

Assistant:

void Map_MappingReportChoices( Map_Man_t * pMan )
{
    Map_Node_t * pNode, * pTemp;
    int nChoiceNodes, nChoices;
    int i, LevelMax1, LevelMax2;

    // report the number of levels
    LevelMax1 = Map_MappingGetMaxLevel( pMan );
    pMan->nTravIds++;
    for ( i = 0; i < pMan->nOutputs; i++ )
        Map_MappingUpdateLevel_rec( pMan, Map_Regular(pMan->pOutputs[i]), 0 );
    LevelMax2 = Map_MappingGetMaxLevel( pMan );

    // report statistics about choices
    nChoiceNodes = nChoices = 0;
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( pNode->pRepr == NULL && pNode->pNextE != NULL )
        { // this is a choice node = the primary node that has equivalent nodes
            nChoiceNodes++;
            for ( pTemp = pNode; pTemp; pTemp = pTemp->pNextE )
                nChoices++;
        }
    }
    printf( "Maximum level: Original = %d. Reduced due to choices = %d.\n", LevelMax1, LevelMax2 );
    printf( "Choice stats:  Choice nodes = %d. Total choices = %d.\n", nChoiceNodes, nChoices );
}